

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choices.hpp
# Opt level: O0

int Random::WeightedChoiceIndex<std::shared_ptr<Reaction>>
              (vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
               *population,vector<double,_std::allocator<double>_> *weights)

{
  size_type __n;
  const_iterator __first;
  const_iterator __last;
  iterator __result;
  reference pvVar1;
  difference_type dVar2;
  pointer extraout_XMM0_Qa;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_a8;
  int local_9c;
  double dStack_98;
  int index;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_90;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_88;
  double *local_80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_78;
  iterator upper;
  allocator<double> local_39;
  undefined1 local_38 [8];
  vector<double,_std::allocator<double>_> cum_weights;
  double random_num;
  vector<double,_std::allocator<double>_> *weights_local;
  vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_> *population_local;
  
  random();
  cum_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = extraout_XMM0_Qa;
  __n = std::vector<double,_std::allocator<double>_>::size(weights);
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_38,__n,&local_39);
  std::allocator<double>::~allocator(&local_39);
  __first = std::vector<double,_std::allocator<double>_>::begin(weights);
  __last = std::vector<double,_std::allocator<double>_>::end(weights);
  __result = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)local_38);
  upper._M_current =
       (double *)
       std::
       partial_sum<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                 (__first._M_current,__last._M_current,__result._M_current);
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator(&local_78);
  local_88._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)local_38);
  local_90._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::end
                 ((vector<double,_std::allocator<double>_> *)local_38);
  pvVar1 = std::vector<double,_std::allocator<double>_>::back
                     ((vector<double,_std::allocator<double>_> *)local_38);
  dStack_98 = (double)cum_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage * *pvVar1;
  local_80 = (double *)
             std::
             upper_bound<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                       (local_88,local_90,&stack0xffffffffffffff68);
  local_78 = (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)local_80;
  local_a8._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)local_38);
  dVar2 = __gnu_cxx::operator-(&local_78,&local_a8);
  local_9c = (int)dVar2;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  return (int)dVar2;
}

Assistant:

int WeightedChoiceIndex(const std::vector<T> &population,
                        const std::vector<double> &weights) {
  double random_num = random();
  // Calculate cumulative sums for weights
  std::vector<double> cum_weights(weights.size());
  std::partial_sum(weights.begin(), weights.end(), cum_weights.begin());
  // Bisect cumulative weights vector
  std::vector<double>::iterator upper;
  upper = std::upper_bound(cum_weights.begin(), cum_weights.end(),
                           random_num * cum_weights.back());
  // Calculate index and return list item at index
  int index = (upper - cum_weights.begin());
  return index;
}